

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void embree::SceneGraph::set_motion_vector(Ref<embree::SceneGraph::Node> *node,Vec3fa *dP)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vec3fx *pVVar3;
  Node *pNVar4;
  undefined8 uVar5;
  ulong uVar6;
  size_t sVar7;
  long *plVar8;
  long *plVar9;
  long lVar10;
  long *plVar11;
  float *pfVar12;
  ulong uVar13;
  size_t sVar14;
  Vec3fa *P;
  float *pfVar15;
  Vec3fa *P_1;
  Vec3fx *P_3;
  long *plVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> vStack_b8;
  long *local_98;
  long *local_90;
  long *local_88;
  long *local_80;
  float *local_78;
  long *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  long *local_50;
  long *local_48;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar8 = (long *)0x0;
  }
  else {
    plVar8 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo);
  }
  if (plVar8 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar9 = (long *)0x0;
    }
    else {
      plVar9 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo);
    }
    local_50 = plVar8;
    if (plVar9 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        local_98 = (long *)0x0;
      }
      else {
        local_98 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo);
      }
      local_80 = plVar9;
      if (local_98 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          local_88 = (long *)0x0;
        }
        else {
          local_88 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo);
        }
        if (local_88 == (long *)0x0) {
          if (node->ptr == (Node *)0x0) {
            plVar11 = (long *)0x0;
          }
          else {
            plVar11 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GridMeshNode::typeinfo);
          }
          local_70 = plVar11;
          if (plVar11 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              local_90 = (long *)0x0;
            }
            else {
              local_90 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo);
            }
            if (local_90 != (long *)0x0) {
              (**(code **)(*local_90 + 0x10))();
            }
            plVar9 = local_80;
            if (local_90 == (long *)0x0) {
              if (node->ptr == (Node *)0x0) {
                local_48 = (long *)0x0;
              }
              else {
                local_48 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&PointSetNode::typeinfo)
                ;
              }
              if (local_48 == (long *)0x0) {
                if (node->ptr == (Node *)0x0) {
                  pfVar12 = (float *)0x0;
                }
                else {
                  pfVar12 = (float *)__dynamic_cast(node->ptr,&Node::typeinfo,
                                                    &SubdivMeshNode::typeinfo,0);
                }
                if (pfVar12 != (float *)0x0) {
                  (**(code **)(*(long *)pfVar12 + 0x10))(pfVar12);
                  vStack_b8.size_active = 0;
                  vStack_b8.size_alloced = 0;
                  vStack_b8.items = (Vec3fx *)0x0;
                  lVar10 = *(long *)(*(long *)(pfVar12 + 0x1e) + -0x18);
                  local_78 = pfVar12;
                  if (lVar10 != 0) {
                    pfVar12 = *(float **)(*(long *)(pfVar12 + 0x1e) + -8);
                    pfVar15 = pfVar12 + lVar10 * 4;
                    do {
                      pVVar3 = vStack_b8.items;
                      sVar7 = vStack_b8.size_active;
                      uVar13 = vStack_b8.size_active + 1;
                      sVar14 = vStack_b8.size_alloced;
                      if ((vStack_b8.size_alloced < uVar13) &&
                         (sVar14 = uVar13, uVar6 = vStack_b8.size_alloced,
                         vStack_b8.size_alloced != 0)) {
                        for (; sVar14 = uVar6, uVar6 < uVar13;
                            uVar6 = uVar6 * 2 + (ulong)(uVar6 * 2 == 0)) {
                        }
                      }
                      fVar17 = *pfVar12 + (dP->field_0).m128[0];
                      fVar18 = pfVar12[1] + (dP->field_0).m128[1];
                      fVar19 = pfVar12[2] + (dP->field_0).m128[2];
                      fVar20 = pfVar12[3] + (dP->field_0).m128[3];
                      if (vStack_b8.size_alloced != sVar14) {
                        local_68 = fVar17;
                        fStack_64 = fVar18;
                        fStack_60 = fVar19;
                        fStack_5c = fVar20;
                        vStack_b8.items = (Vec3fx *)alignedMalloc(sVar14 << 4,0x10);
                        if (vStack_b8.size_active != 0) {
                          lVar10 = 0;
                          uVar13 = 0;
                          do {
                            puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar10);
                            uVar5 = puVar2[1];
                            puVar1 = (undefined8 *)((long)&(vStack_b8.items)->field_0 + lVar10);
                            *puVar1 = *puVar2;
                            puVar1[1] = uVar5;
                            uVar13 = uVar13 + 1;
                            lVar10 = lVar10 + 0x10;
                          } while (uVar13 < vStack_b8.size_active);
                        }
                        alignedFree(pVVar3);
                        fVar17 = local_68;
                        fVar18 = fStack_64;
                        fVar19 = fStack_60;
                        fVar20 = fStack_5c;
                        vStack_b8.size_alloced = sVar14;
                      }
                      vStack_b8.size_active = sVar7 + 1;
                      pVVar3 = vStack_b8.items + sVar7;
                      (pVVar3->field_0).m128[0] = fVar17;
                      (pVVar3->field_0).m128[1] = fVar18;
                      (pVVar3->field_0).m128[2] = fVar19;
                      (pVVar3->field_0).m128[3] = fVar20;
                      pfVar12 = pfVar12 + 4;
                    } while (pfVar12 != pfVar15);
                  }
                  std::
                  vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  ::
                  emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                            ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                              *)(local_78 + 0x1c),
                             (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                              *)&vStack_b8);
                  alignedFree(vStack_b8.items);
                  vStack_b8.size_active = 0;
                  vStack_b8.size_alloced = 0;
                  vStack_b8.items = (Vec3fx *)0x0;
                  pfVar12 = local_78;
                  plVar11 = local_70;
                  plVar9 = local_80;
                }
                plVar16 = local_88;
                plVar8 = local_98;
                if (pfVar12 != (float *)0x0) {
                  (**(code **)(*(long *)pfVar12 + 0x18))(pfVar12);
                }
              }
              else {
                (**(code **)(*local_48 + 0x10))(local_48);
                vStack_b8.size_active = 0;
                vStack_b8.size_alloced = 0;
                vStack_b8.items = (Vec3fx *)0x0;
                lVar10 = *(long *)(local_48[0x10] + -0x18);
                if (lVar10 != 0) {
                  pfVar12 = *(float **)(local_48[0x10] + -8);
                  pfVar15 = pfVar12 + lVar10 * 4;
                  local_78 = pfVar15;
                  do {
                    pVVar3 = vStack_b8.items;
                    sVar7 = vStack_b8.size_active;
                    uVar13 = vStack_b8.size_active + 1;
                    sVar14 = vStack_b8.size_alloced;
                    if ((vStack_b8.size_alloced < uVar13) &&
                       (sVar14 = uVar13, uVar6 = vStack_b8.size_alloced, vStack_b8.size_alloced != 0
                       )) {
                      for (; sVar14 = uVar6, uVar6 < uVar13;
                          uVar6 = uVar6 * 2 + (ulong)(uVar6 * 2 == 0)) {
                      }
                    }
                    fVar17 = (dP->field_0).m128[0] + *pfVar12;
                    fVar18 = (dP->field_0).m128[1] + pfVar12[1];
                    fVar19 = (dP->field_0).m128[2] + pfVar12[2];
                    fVar20 = pfVar12[3] + 0.0;
                    if (vStack_b8.size_alloced != sVar14) {
                      local_68 = fVar17;
                      fStack_64 = fVar18;
                      fStack_60 = fVar19;
                      fStack_5c = pfVar12[3] + 0.0;
                      vStack_b8.items = (Vec3fx *)alignedMalloc(sVar14 << 4,0x10);
                      if (vStack_b8.size_active != 0) {
                        lVar10 = 0;
                        uVar13 = 0;
                        do {
                          puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar10);
                          uVar5 = puVar2[1];
                          puVar1 = (undefined8 *)((long)&(vStack_b8.items)->field_0 + lVar10);
                          *puVar1 = *puVar2;
                          puVar1[1] = uVar5;
                          uVar13 = uVar13 + 1;
                          lVar10 = lVar10 + 0x10;
                        } while (uVar13 < vStack_b8.size_active);
                      }
                      alignedFree(pVVar3);
                      pfVar15 = local_78;
                      fVar17 = local_68;
                      fVar18 = fStack_64;
                      fVar19 = fStack_60;
                      fVar20 = fStack_5c;
                      vStack_b8.size_alloced = sVar14;
                    }
                    vStack_b8.size_active = sVar7 + 1;
                    pVVar3 = vStack_b8.items + sVar7;
                    (pVVar3->field_0).m128[0] = fVar17;
                    (pVVar3->field_0).m128[1] = fVar18;
                    (pVVar3->field_0).m128[2] = fVar19;
                    (pVVar3->field_0).m128[3] = fVar20;
                    pfVar12 = pfVar12 + 4;
                  } while (pfVar12 != pfVar15);
                }
                plVar8 = local_48;
                std::
                vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                ::
                emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                          ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                            *)(local_48 + 0xf),&vStack_b8);
                if ((value_type *)plVar8[0x13] != (value_type *)plVar8[0x12]) {
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::push_back((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                               *)(plVar8 + 0x12),(value_type *)plVar8[0x12]);
                }
                alignedFree(vStack_b8.items);
                vStack_b8.size_active = 0;
                vStack_b8.size_alloced = 0;
                vStack_b8.items = (Vec3fx *)0x0;
                plVar8 = local_98;
                plVar11 = local_70;
                plVar16 = local_88;
              }
              if (local_48 != (long *)0x0) {
                (**(code **)(*local_48 + 0x18))(local_48);
              }
            }
            else {
              vStack_b8.size_active = 0;
              vStack_b8.size_alloced = 0;
              vStack_b8.items = (Vec3fx *)0x0;
              lVar10 = *(long *)(local_90[0x10] + -0x18);
              if (lVar10 != 0) {
                pfVar12 = *(float **)(local_90[0x10] + -8);
                pfVar15 = pfVar12 + lVar10 * 4;
                local_78 = pfVar15;
                do {
                  pVVar3 = vStack_b8.items;
                  sVar7 = vStack_b8.size_active;
                  uVar13 = vStack_b8.size_active + 1;
                  sVar14 = vStack_b8.size_alloced;
                  if ((vStack_b8.size_alloced < uVar13) &&
                     (sVar14 = uVar13, uVar6 = vStack_b8.size_alloced, vStack_b8.size_alloced != 0))
                  {
                    for (; sVar14 = uVar6, uVar6 < uVar13;
                        uVar6 = uVar6 * 2 + (ulong)(uVar6 * 2 == 0)) {
                    }
                  }
                  fVar17 = (dP->field_0).m128[0] + *pfVar12;
                  fVar18 = (dP->field_0).m128[1] + pfVar12[1];
                  fVar19 = (dP->field_0).m128[2] + pfVar12[2];
                  fVar20 = pfVar12[3] + 0.0;
                  if (vStack_b8.size_alloced != sVar14) {
                    local_68 = fVar17;
                    fStack_64 = fVar18;
                    fStack_60 = fVar19;
                    fStack_5c = pfVar12[3] + 0.0;
                    vStack_b8.items = (Vec3fx *)alignedMalloc(sVar14 << 4,0x10);
                    if (vStack_b8.size_active != 0) {
                      lVar10 = 0;
                      uVar13 = 0;
                      do {
                        puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar10);
                        uVar5 = puVar2[1];
                        puVar1 = (undefined8 *)((long)&(vStack_b8.items)->field_0 + lVar10);
                        *puVar1 = *puVar2;
                        puVar1[1] = uVar5;
                        uVar13 = uVar13 + 1;
                        lVar10 = lVar10 + 0x10;
                      } while (uVar13 < vStack_b8.size_active);
                    }
                    alignedFree(pVVar3);
                    pfVar15 = local_78;
                    fVar17 = local_68;
                    fVar18 = fStack_64;
                    fVar19 = fStack_60;
                    fVar20 = fStack_5c;
                    vStack_b8.size_alloced = sVar14;
                  }
                  vStack_b8.size_active = sVar7 + 1;
                  pVVar3 = vStack_b8.items + sVar7;
                  (pVVar3->field_0).m128[0] = fVar17;
                  (pVVar3->field_0).m128[1] = fVar18;
                  (pVVar3->field_0).m128[2] = fVar19;
                  (pVVar3->field_0).m128[3] = fVar20;
                  pfVar12 = pfVar12 + 4;
                } while (pfVar12 != pfVar15);
              }
              std::
              vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
              ::
              emplace_back<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>
                        ((vector<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>,std::allocator<embree::vector_t<embree::Vec3fx,embree::aligned_allocator<embree::Vec3fx,16ul>>>>
                          *)(local_90 + 0xf),&vStack_b8);
              alignedFree(vStack_b8.items);
              vStack_b8.size_active = 0;
              vStack_b8.size_alloced = 0;
              vStack_b8.items = (Vec3fx *)0x0;
              plVar8 = local_98;
              plVar11 = local_70;
              plVar16 = local_88;
            }
            if (local_90 != (long *)0x0) {
              (**(code **)(*local_90 + 0x18))();
            }
          }
          else {
            (**(code **)(*plVar11 + 0x10))(plVar11);
            vStack_b8.size_active = 0;
            vStack_b8.size_alloced = 0;
            vStack_b8.items = (Vec3fx *)0x0;
            lVar10 = *(long *)(plVar11[0xf] + -0x18);
            if (lVar10 != 0) {
              pfVar12 = *(float **)(plVar11[0xf] + -8);
              pfVar15 = pfVar12 + lVar10 * 4;
              do {
                pVVar3 = vStack_b8.items;
                sVar7 = vStack_b8.size_active;
                uVar13 = vStack_b8.size_active + 1;
                sVar14 = vStack_b8.size_alloced;
                if ((vStack_b8.size_alloced < uVar13) &&
                   (sVar14 = uVar13, uVar6 = vStack_b8.size_alloced, vStack_b8.size_alloced != 0)) {
                  for (; sVar14 = uVar6, uVar6 < uVar13; uVar6 = uVar6 * 2 + (ulong)(uVar6 * 2 == 0)
                      ) {
                  }
                }
                fVar17 = *pfVar12 + (dP->field_0).m128[0];
                fVar18 = pfVar12[1] + (dP->field_0).m128[1];
                fVar19 = pfVar12[2] + (dP->field_0).m128[2];
                fVar20 = pfVar12[3] + (dP->field_0).m128[3];
                if (vStack_b8.size_alloced != sVar14) {
                  local_68 = fVar17;
                  fStack_64 = fVar18;
                  fStack_60 = fVar19;
                  fStack_5c = fVar20;
                  vStack_b8.items = (Vec3fx *)alignedMalloc(sVar14 << 4,0x10);
                  if (vStack_b8.size_active != 0) {
                    lVar10 = 0;
                    uVar13 = 0;
                    do {
                      puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar10);
                      uVar5 = puVar2[1];
                      puVar1 = (undefined8 *)((long)&(vStack_b8.items)->field_0 + lVar10);
                      *puVar1 = *puVar2;
                      puVar1[1] = uVar5;
                      uVar13 = uVar13 + 1;
                      lVar10 = lVar10 + 0x10;
                    } while (uVar13 < vStack_b8.size_active);
                  }
                  alignedFree(pVVar3);
                  fVar17 = local_68;
                  fVar18 = fStack_64;
                  fVar19 = fStack_60;
                  fVar20 = fStack_5c;
                  vStack_b8.size_alloced = sVar14;
                }
                vStack_b8.size_active = sVar7 + 1;
                pVVar3 = vStack_b8.items + sVar7;
                (pVVar3->field_0).m128[0] = fVar17;
                (pVVar3->field_0).m128[1] = fVar18;
                (pVVar3->field_0).m128[2] = fVar19;
                (pVVar3->field_0).m128[3] = fVar20;
                pfVar12 = pfVar12 + 4;
              } while (pfVar12 != pfVar15);
            }
            plVar11 = local_70;
            std::
            vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
            ::
            emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                      ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                        *)(local_70 + 0xe),
                       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *
                       )&vStack_b8);
            alignedFree(vStack_b8.items);
            vStack_b8.size_active = 0;
            vStack_b8.size_alloced = 0;
            vStack_b8.items = (Vec3fx *)0x0;
            plVar8 = local_98;
            plVar9 = local_80;
            plVar16 = local_88;
          }
          if (plVar11 != (long *)0x0) {
            (**(code **)(*plVar11 + 0x18))(plVar11);
          }
        }
        else {
          (**(code **)(*local_88 + 0x10))(local_88);
          vStack_b8.size_active = 0;
          vStack_b8.size_alloced = 0;
          vStack_b8.items = (Vec3fx *)0x0;
          lVar10 = *(long *)(local_88[0xf] + -0x18);
          if (lVar10 != 0) {
            pfVar12 = *(float **)(local_88[0xf] + -8);
            pfVar15 = pfVar12 + lVar10 * 4;
            do {
              pVVar3 = vStack_b8.items;
              sVar7 = vStack_b8.size_active;
              uVar13 = vStack_b8.size_active + 1;
              sVar14 = vStack_b8.size_alloced;
              if ((vStack_b8.size_alloced < uVar13) &&
                 (sVar14 = uVar13, uVar6 = vStack_b8.size_alloced, vStack_b8.size_alloced != 0)) {
                for (; sVar14 = uVar6, uVar6 < uVar13; uVar6 = uVar6 * 2 + (ulong)(uVar6 * 2 == 0))
                {
                }
              }
              fVar17 = *pfVar12 + (dP->field_0).m128[0];
              fVar18 = pfVar12[1] + (dP->field_0).m128[1];
              fVar19 = pfVar12[2] + (dP->field_0).m128[2];
              fVar20 = pfVar12[3] + (dP->field_0).m128[3];
              if (vStack_b8.size_alloced != sVar14) {
                local_68 = fVar17;
                fStack_64 = fVar18;
                fStack_60 = fVar19;
                fStack_5c = fVar20;
                vStack_b8.items = (Vec3fx *)alignedMalloc(sVar14 << 4,0x10);
                if (vStack_b8.size_active != 0) {
                  lVar10 = 0;
                  uVar13 = 0;
                  do {
                    puVar2 = (undefined8 *)((long)&pVVar3->field_0 + lVar10);
                    uVar5 = puVar2[1];
                    puVar1 = (undefined8 *)((long)&(vStack_b8.items)->field_0 + lVar10);
                    *puVar1 = *puVar2;
                    puVar1[1] = uVar5;
                    uVar13 = uVar13 + 1;
                    lVar10 = lVar10 + 0x10;
                  } while (uVar13 < vStack_b8.size_active);
                }
                alignedFree(pVVar3);
                fVar17 = local_68;
                fVar18 = fStack_64;
                fVar19 = fStack_60;
                fVar20 = fStack_5c;
                vStack_b8.size_alloced = sVar14;
              }
              vStack_b8.size_active = sVar7 + 1;
              pVVar3 = vStack_b8.items + sVar7;
              (pVVar3->field_0).m128[0] = fVar17;
              (pVVar3->field_0).m128[1] = fVar18;
              (pVVar3->field_0).m128[2] = fVar19;
              (pVVar3->field_0).m128[3] = fVar20;
              pfVar12 = pfVar12 + 4;
            } while (pfVar12 != pfVar15);
          }
          plVar16 = local_88;
          std::
          vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
          ::
          emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                    ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      *)(local_88 + 0xe),
                     (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     &vStack_b8);
          alignedFree(vStack_b8.items);
          vStack_b8.size_active = 0;
          vStack_b8.size_alloced = 0;
          vStack_b8.items = (Vec3fx *)0x0;
          plVar8 = local_98;
          plVar9 = local_80;
        }
        if (plVar16 != (long *)0x0) {
          (**(code **)(*plVar16 + 0x18))(plVar16);
        }
      }
      else {
        (**(code **)(*local_98 + 0x10))(local_98);
        vStack_b8.size_active = 0;
        vStack_b8.size_alloced = 0;
        vStack_b8.items = (Vec3fx *)0x0;
        lVar10 = *(long *)(local_98[0xf] + -0x18);
        if (lVar10 != 0) {
          pfVar12 = *(float **)(local_98[0xf] + -8);
          pfVar15 = pfVar12 + lVar10 * 4;
          do {
            pVVar3 = vStack_b8.items;
            sVar7 = vStack_b8.size_active;
            uVar13 = vStack_b8.size_active + 1;
            sVar14 = vStack_b8.size_alloced;
            if ((vStack_b8.size_alloced < uVar13) &&
               (sVar14 = uVar13, uVar6 = vStack_b8.size_alloced, vStack_b8.size_alloced != 0)) {
              for (; sVar14 = uVar6, uVar6 < uVar13; uVar6 = uVar6 * 2 + (ulong)(uVar6 * 2 == 0)) {
              }
            }
            fVar17 = *pfVar12 + (dP->field_0).m128[0];
            fVar18 = pfVar12[1] + (dP->field_0).m128[1];
            fVar19 = pfVar12[2] + (dP->field_0).m128[2];
            fVar20 = pfVar12[3] + (dP->field_0).m128[3];
            if (vStack_b8.size_alloced != sVar14) {
              local_68 = fVar17;
              fStack_64 = fVar18;
              fStack_60 = fVar19;
              fStack_5c = fVar20;
              vStack_b8.items = (Vec3fx *)alignedMalloc(sVar14 << 4,0x10);
              if (vStack_b8.size_active != 0) {
                lVar10 = 0;
                uVar13 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&pVVar3->field_0 + lVar10);
                  uVar5 = puVar1[1];
                  puVar2 = (undefined8 *)((long)&(vStack_b8.items)->field_0 + lVar10);
                  *puVar2 = *puVar1;
                  puVar2[1] = uVar5;
                  uVar13 = uVar13 + 1;
                  lVar10 = lVar10 + 0x10;
                } while (uVar13 < vStack_b8.size_active);
              }
              alignedFree(pVVar3);
              fVar17 = local_68;
              fVar18 = fStack_64;
              fVar19 = fStack_60;
              fVar20 = fStack_5c;
              vStack_b8.size_alloced = sVar14;
            }
            vStack_b8.size_active = sVar7 + 1;
            pVVar3 = vStack_b8.items + sVar7;
            (pVVar3->field_0).m128[0] = fVar17;
            (pVVar3->field_0).m128[1] = fVar18;
            (pVVar3->field_0).m128[2] = fVar19;
            (pVVar3->field_0).m128[3] = fVar20;
            pfVar12 = pfVar12 + 4;
          } while (pfVar12 != pfVar15);
        }
        plVar8 = local_98;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)(local_98 + 0xe),
                   (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                   &vStack_b8);
        alignedFree(vStack_b8.items);
        vStack_b8.size_active = 0;
        vStack_b8.size_alloced = 0;
        vStack_b8.items = (Vec3fx *)0x0;
        plVar9 = local_80;
      }
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar8 + 0x18))(plVar8);
      }
    }
    else {
      (**(code **)(*plVar9 + 0x10))(plVar9);
      lVar10 = plVar9[0xd];
      if (plVar9[0xe] != lVar10) {
        uVar13 = 0;
        do {
          pNVar4 = *(Node **)(lVar10 + uVar13 * 8);
          local_40.ptr = pNVar4;
          if (pNVar4 != (Node *)0x0) {
            (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
          }
          set_motion_vector(&local_40,dP);
          if (pNVar4 != (Node *)0x0) {
            (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
          }
          uVar13 = uVar13 + 1;
          lVar10 = plVar9[0xd];
        } while (uVar13 < (ulong)(plVar9[0xe] - lVar10 >> 3));
      }
    }
    plVar8 = local_50;
    if (plVar9 != (long *)0x0) {
      (**(code **)(*plVar9 + 0x18))(plVar9);
    }
  }
  else {
    (**(code **)(*plVar8 + 0x10))(plVar8);
    pNVar4 = (Node *)plVar8[0x13];
    local_38.ptr = pNVar4;
    if (pNVar4 != (Node *)0x0) {
      (*(pNVar4->super_RefCount)._vptr_RefCount[2])(pNVar4);
    }
    set_motion_vector(&local_38,dP);
    if (pNVar4 != (Node *)0x0) {
      (*(pNVar4->super_RefCount)._vptr_RefCount[3])(pNVar4);
    }
  }
  if (plVar8 != (long *)0x0) {
    (**(code **)(*plVar8 + 0x18))(plVar8);
  }
  return;
}

Assistant:

void SceneGraph::set_motion_vector(Ref<SceneGraph::Node> node, const Vec3fa& dP)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      set_motion_vector(xfmNode->child, dP);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        set_motion_vector(groupNode->children[i],dP);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      avector<Vec3fa> positions1;
      for (auto& P : mesh->positions.back()) 
        positions1.push_back(P+dP);
      mesh->positions.push_back(std::move(positions1));
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      avector<Vec3fa> positions1;
      for (auto& P : mesh->positions.back()) 
        positions1.push_back(P+dP);
      mesh->positions.push_back(std::move(positions1));
    }
    else if (Ref<SceneGraph::GridMeshNode> mesh = node.dynamicCast<SceneGraph::GridMeshNode>()) 
    {
      avector<Vec3fa> positions1;
      for (auto& P : mesh->positions.back()) 
        positions1.push_back(P+dP);
      mesh->positions.push_back(std::move(positions1));
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      avector<Vec3ff> positions1;
      for (auto& P : mesh->positions.back()) 
        positions1.push_back(P+Vec3ff(dP,0.0f));
      mesh->positions.push_back(std::move(positions1));
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      avector<Vec3ff> positions1;
      for (auto& P : mesh->positions.back())
        positions1.push_back(P+Vec3ff(dP,0.0f));
      mesh->positions.push_back(std::move(positions1));

      if (mesh->normals.size())
        mesh->normals.push_back(mesh->normals[0]);
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      avector<Vec3fa> positions1;
      for (auto& P : mesh->positions.back())
        positions1.push_back(P+dP);
      mesh->positions.push_back(std::move(positions1));
    }
  }